

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  integer_type_conflict *piVar6;
  longlong *plVar7;
  uint *puVar8;
  floating_point_type *pfVar9;
  byte *pbVar10;
  uchar *puVar11;
  unsigned_t val;
  uchar local_5a6;
  bool local_59a;
  byte local_599;
  byte local_592;
  floating_point_type local_590;
  floating_point_type local_58c;
  floating_point_type local_584;
  uint local_57c;
  longlong local_578;
  integer_type_conflict local_56c;
  floating_point<float> local_54c;
  undefined8 uStack_548;
  float_t float_val2;
  undefined8 local_540;
  floating_point<double> local_538;
  double_t double_val;
  integer<unsigned_int,_type_safe::undefined_behavior_arithmetic> iStack_528;
  uint8_t uint8_val2;
  undefined4 local_524;
  uint32_t uint32_val;
  double_t d3;
  floating_point<double> local_510;
  double_t d1;
  char local_4ff;
  byte local_4fe;
  integer<signed_char,_type_safe::undefined_behavior_arithmetic> local_4fd;
  float_t f1;
  integer<unsigned_int,_type_safe::undefined_behavior_arithmetic> iStack_4f8;
  int8_t i6;
  integer<unsigned_int,_type_safe::undefined_behavior_arithmetic> local_4f4;
  unsigned_t u7;
  unsigned_t u5;
  undefined8 uStack_4e8;
  uint8_t u4;
  integer<long_long,_type_safe::undefined_behavior_arithmetic> local_4e0;
  integer<long_long,_type_safe::undefined_behavior_arithmetic> i4;
  undefined4 local_4d0;
  integer<unsigned_int,_type_safe::undefined_behavior_arithmetic> local_4cc;
  undefined4 local_4c8;
  unsigned_t u1;
  byte local_4be;
  boolean local_4bd;
  int_t i1;
  bool_t b4;
  bool_t b1;
  undefined1 local_4a9;
  byte *local_4a8;
  undefined4 *local_4a0;
  unsigned_t *local_498;
  undefined4 *local_490;
  integer<unsigned_int,_type_safe::undefined_behavior_arithmetic> *local_488;
  undefined4 local_47c;
  undefined1 *local_478;
  unsigned_t *local_470;
  undefined1 *local_468;
  undefined4 *local_460;
  undefined8 local_458;
  undefined1 *local_450;
  unsigned_t *local_448;
  longlong local_440;
  undefined1 *local_438;
  unsigned_t *local_430;
  integer_type_conflict local_428;
  uint local_424;
  unsigned_t *local_420;
  undefined1 local_414 [4];
  uint *local_410;
  undefined1 *local_408;
  undefined4 local_400;
  floating_point_type local_3fc;
  float_t *local_3f8;
  floating_point_type local_3ec;
  floating_point_type local_3e8;
  floating_point_type local_3e4;
  floating_point_type *local_3e0;
  undefined1 local_3d4 [4];
  floating_point_type *local_3d0;
  undefined1 *local_3c8;
  floating_point_type local_3bc;
  float_t *local_3b8;
  undefined1 local_3ac [4];
  floating_point_type *local_3a8;
  undefined1 *local_3a0;
  floating_point_type local_394;
  unsigned_t *local_390;
  undefined1 local_384 [4];
  floating_point_type *local_380;
  undefined1 *local_378;
  byte local_36a;
  byte local_369;
  byte *local_368;
  undefined1 local_35a;
  byte local_359;
  char *local_358;
  undefined1 *local_350;
  undefined1 local_341;
  double_t *local_340;
  undefined1 *local_338;
  double_t *local_330;
  floating_point<double> *local_328;
  undefined8 *local_320;
  floating_point<double> *local_318;
  undefined4 *local_310;
  uint32_t *local_308;
  uint local_300;
  uchar local_2f9;
  undefined1 *local_2f8;
  undefined1 local_2e9;
  undefined1 *local_2e8;
  floating_point<double> *local_2e0;
  undefined8 local_2d8;
  undefined4 local_2cc;
  floating_point<double> *local_2c8;
  undefined1 local_2bc [4];
  undefined4 *local_2b8;
  undefined1 *local_2b0;
  byte local_2a1;
  undefined1 *local_2a0;
  longlong local_298;
  undefined8 *local_290;
  unsigned_t *local_288;
  undefined1 local_280 [8];
  longlong *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined8 *local_260;
  char *local_258;
  undefined4 local_250;
  regular_void local_241;
  long local_240;
  long local_238;
  unsigned_t *local_230;
  floating_point_type *local_228;
  unsigned_t *local_220;
  undefined8 *local_218;
  uchar *local_210;
  undefined1 *local_208;
  byte *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  byte *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  undefined4 local_1c8;
  regular_void local_1b9;
  floating_point_type *local_1b8;
  char *local_1b0;
  undefined4 local_1a8;
  regular_void local_199;
  integer_type_conflict *local_198;
  undefined4 local_18c;
  undefined4 *local_188;
  float_t *local_180;
  undefined4 *local_178;
  undefined4 *local_170;
  undefined4 *local_168;
  float_t *local_160;
  float_t *local_158;
  undefined4 *local_150;
  float_t *local_148;
  undefined4 *local_140;
  char *local_138;
  undefined4 local_130;
  regular_void local_121;
  int local_120;
  integer_type_conflict local_11c;
  char *local_118;
  undefined4 local_110;
  regular_void local_101;
  int local_100;
  floating_point_type local_fc;
  char *local_f8;
  undefined4 local_f0;
  regular_void local_e1;
  byte *local_e0;
  byte *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined4 local_c0;
  regular_void local_b3;
  char local_b2;
  byte local_b1;
  char *local_b0;
  undefined4 local_a8;
  regular_void local_99;
  uint *local_98;
  undefined1 *local_90;
  undefined4 local_84;
  uint *local_80;
  undefined8 *local_60;
  floating_point<double> *local_58;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 *local_40;
  unsigned_t *local_38;
  undefined4 *local_30;
  char *local_28;
  undefined4 local_20;
  regular_void local_11;
  int local_10;
  integer_type_conflict local_c;
  
  i1.value_ = 0;
  local_4bd.value_ = true;
  poVar4 = std::operator<<((ostream *)&std::cout,"boolean value: ");
  pbVar5 = type_safe::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&local_4bd);
  std::operator<<((ostream *)pbVar5,'\n');
  local_2a0 = &local_4a9;
  local_4be = (local_4bd.value_ ^ 0xffU) & 1;
  local_4a8 = &local_4be;
  local_2a1 = local_4be;
  if (local_4be == 0) {
    std::operator<<((ostream *)&std::cout,"b4 is false\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"b4 is true\n");
  }
  local_4c8 = 0;
  local_4a0 = &local_4c8;
  u1.value_ = 0;
  local_4d0 = 0;
  local_490 = &local_4d0;
  local_4cc.value_ = 0;
  local_498 = &u1;
  local_488 = &local_4cc;
  poVar4 = std::operator<<((ostream *)&std::cout,"integer value: ");
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                      (integer<int,_type_safe::undefined_behavior_arithmetic> *)&u1);
  poVar4 = std::operator<<((ostream *)pbVar5,' ');
  pbVar5 = type_safe::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&local_4cc);
  std::operator<<((ostream *)pbVar5,'\n');
  i4.value_._4_4_ = 4;
  local_478 = (undefined1 *)((long)&i4.value_ + 4);
  local_460 = &local_47c;
  local_47c = 4;
  local_c = u1.value_;
  local_10 = 4;
  local_470 = &u1;
  local_468 = local_478;
  local_40 = local_460;
  local_38 = &u1;
  local_30 = local_460;
  bVar1 = type_safe::detail::will_addition_error<int>(u1.value_,4);
  if (bVar1) {
    local_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_20 = 0x91;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[33]>
              (debug_assert::detail::always_false,&local_28,"","addition will result in overflow");
    piVar6 = (integer_type_conflict *)
             debug_assert::detail::regular_void::operator_cast_to_int_(&local_11);
    local_56c = *piVar6;
  }
  else {
    local_56c = local_c + local_10;
  }
  u1.value_ = local_56c;
  uStack_4e8 = 100;
  local_448 = &u1;
  local_450 = (undefined1 *)&stack0xfffffffffffffb18;
  local_290 = &local_458;
  local_458 = 100;
  local_238 = (long)(int)local_56c;
  local_240 = 100;
  local_288 = local_448;
  local_268 = local_450;
  local_260 = local_290;
  local_230 = local_448;
  local_218 = local_290;
  bVar1 = type_safe::detail::will_addition_error<long_long>(local_238,100);
  if (bVar1) {
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_250 = 0x91;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[33]>
              (debug_assert::detail::always_false,&local_258,"","addition will result in overflow");
    plVar7 = debug_assert::detail::regular_void::operator_cast_to_long_long_(&local_241);
    local_578 = *plVar7;
  }
  else {
    local_578 = local_238 + local_240;
  }
  local_298 = local_578;
  local_270 = local_280;
  local_278 = &local_298;
  local_440 = local_578;
  local_4e0.value_ = local_578;
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_4e0);
  std::operator<<((ostream *)pbVar5,'\n');
  u5.value_._3_1_ =
       type_safe::types::literals::operator____u8<(char)50,(char)53,(char)53>((literals *)pbVar5);
  local_430 = &u7;
  local_438 = (undefined1 *)((long)&u5.value_ + 3);
  val.value_._1_3_ = 0;
  val.value_._0_1_ = u5.value_._3_1_;
  local_1d8 = local_438;
  only_unsigned(val);
  local_420 = &u1;
  local_428 = u1.value_;
  local_198 = &local_428;
  local_220 = local_420;
  if ((int)u1.value_ < 0) {
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_1a8 = 0x186;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[27]>
              (debug_assert::detail::always_false,&local_1b0,"","conversion would underflow");
    puVar8 = debug_assert::detail::regular_void::operator_cast_to_unsigned_int_(&local_199);
    local_57c = *puVar8;
  }
  else {
    local_57c = u1.value_;
  }
  local_424 = local_57c;
  local_408 = local_414;
  local_410 = &local_424;
  local_4f4.value_ = local_57c;
  local_390 = &u1;
  local_11c = u1.value_;
  local_120 = -1;
  bVar1 = type_safe::detail::will_multiplication_error<int>(u1.value_,0xffffffff);
  if (bVar1) {
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_130 = 0xa3;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[39]>
              (debug_assert::detail::always_false,&local_138,"",
               "multiplication will result in overflow");
    pfVar9 = (floating_point_type *)
             debug_assert::detail::regular_void::operator_cast_to_int_(&local_121);
    local_584 = *pfVar9;
  }
  else {
    local_584 = (floating_point_type)(local_11c * local_120);
  }
  local_394 = local_584;
  local_378 = local_384;
  local_380 = &local_394;
  f1.value_ = local_584;
  local_3f8 = &f1;
  local_400 = 0;
  local_188 = &local_400;
  local_170 = &local_18c;
  local_18c = 0;
  local_168 = &local_18c;
  local_180 = local_3f8;
  local_178 = local_188;
  local_160 = local_3f8;
  local_158 = local_3f8;
  local_150 = local_168;
  local_148 = local_3f8;
  local_140 = local_168;
  if ((int)local_584 < 1) {
    local_fc = local_584;
    local_100 = -1;
    local_3b8 = local_3f8;
    bVar1 = type_safe::detail::will_multiplication_error<int>(local_584,0xffffffff);
    if (bVar1) {
      local_118 = 
      "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
      ;
      local_110 = 0xa3;
      debug_assert::detail::
      do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[39]>
                (debug_assert::detail::always_false,&local_118,"",
                 "multiplication will result in overflow");
      pfVar9 = (floating_point_type *)
               debug_assert::detail::regular_void::operator_cast_to_int_(&local_101);
      local_58c = *pfVar9;
    }
    else {
      local_58c = (floating_point_type)((int)local_fc * local_100);
    }
    local_3bc = local_58c;
    local_3a0 = local_3ac;
    local_3a8 = &local_3bc;
    local_3fc = local_58c;
  }
  else {
    local_3fc = local_584;
  }
  local_3e0 = &local_3fc;
  local_3e8 = local_3fc;
  local_1b8 = &local_3e8;
  local_228 = local_3e0;
  if ((int)local_3fc < 0) {
    local_1d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_1c8 = 0x186;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[27]>
              (debug_assert::detail::always_false,&local_1d0,"","conversion would underflow");
    pfVar9 = (floating_point_type *)
             debug_assert::detail::regular_void::operator_cast_to_unsigned_int_(&local_1b9);
    local_590 = *pfVar9;
  }
  else {
    local_590 = local_3fc;
  }
  local_3e4 = local_590;
  local_3c8 = local_3d4;
  local_3d0 = &local_3e4;
  local_3ec = local_590;
  iStack_4f8.value_ = (integer_type_conflict)local_590;
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_4f4);
  poVar4 = std::operator<<((ostream *)pbVar5,' ');
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                      &stack0xfffffffffffffb08);
  std::operator<<((ostream *)pbVar5,'\n');
  local_4ff = type_safe::types::literals::operator____u8<(char)50,(char)48,(char)48>
                        ((literals *)pbVar5);
  local_350 = (undefined1 *)((long)&u5.value_ + 3);
  local_358 = &local_4ff;
  local_b1 = u5.value_._3_1_;
  local_1f0 = local_358;
  local_1e8 = local_350;
  local_b2 = local_4ff;
  bVar1 = type_safe::detail::will_subtraction_error<unsigned_char>(u5.value_._3_1_,local_4ff);
  if (bVar1) {
    local_c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_c0 = 0x9a;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[37]>
              (debug_assert::detail::always_false,&local_c8,"",
               "subtraction will result in underflow");
    pbVar10 = debug_assert::detail::regular_void::operator_cast_to_unsigned_char_(&local_b3);
    local_592 = *pbVar10;
  }
  else {
    local_592 = local_b1 - local_b2;
  }
  local_359 = local_592;
  local_1f8 = &local_341;
  local_200 = &local_359;
  local_4fe = local_592;
  local_368 = &local_4fe;
  local_36a = local_592;
  local_e0 = &local_36a;
  local_1e0 = local_368;
  bVar2 = std::numeric_limits<signed_char>::max();
  if (bVar2 < local_592) {
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_f0 = 0x167;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[26]>
              (debug_assert::detail::always_false,&local_f8,"","conversion would overflow");
    pbVar10 = debug_assert::detail::regular_void::operator_cast_to_signed_char_(&local_e1);
    local_599 = *pbVar10;
  }
  else {
    local_599 = *local_e0;
  }
  local_369 = local_599;
  local_d0 = &local_35a;
  local_d8 = &local_369;
  local_4fd.value_ = local_599;
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_4fd);
  std::operator<<((ostream *)pbVar5,'\n');
  d1.value_._0_4_ = 0;
  local_338 = (undefined1 *)((long)&d1.value_ + 4);
  local_340 = &d1;
  d1.value_._4_4_ = 0;
  d3.value_ = 0.0;
  local_328 = &local_510;
  local_330 = &d3;
  local_510.value_ = 0.0;
  local_524 = 0;
  local_308 = &uint32_val;
  local_310 = &local_524;
  _uint32_val = 0.0;
  poVar4 = std::operator<<((ostream *)&std::cout,"floating point value: ");
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                      (floating_point<float> *)((long)&d1.value_ + 4));
  poVar4 = std::operator<<((ostream *)pbVar5,' ');
  pbVar5 = type_safe::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&local_510);
  poVar4 = std::operator<<((ostream *)pbVar5,' ');
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                      (floating_point<double> *)&uint32_val);
  std::operator<<((ostream *)pbVar5,'\n');
  iStack_528.value_ =
       type_safe::types::literals::operator____u32<(char)51,(char)50,(char)53>((literals *)pbVar5);
  uVar3 = type_safe::types::literals::operator____u32<(char)49,(char)48,(char)48>
                    ((literals *)pbVar5);
  local_2f8 = (undefined1 *)&stack0xfffffffffffffad8;
  local_98 = &local_300;
  local_84 = 0;
  double_val.value_._4_4_ = uVar3;
  iStack_528.value_ = uVar3;
  local_300 = uVar3;
  local_90 = local_2f8;
  local_80 = local_98;
  bVar2 = std::numeric_limits<unsigned_char>::max();
  local_59a = true;
  if (uVar3 <= bVar2) {
    uVar3 = *local_80;
    bVar2 = std::numeric_limits<unsigned_char>::min();
    local_59a = uVar3 < bVar2;
  }
  if (local_59a) {
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/narrow_cast.hpp"
    ;
    local_a8 = 0x56;
    debug_assert::detail::
    do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[32]>
              (debug_assert::detail::always_false,&local_b0,"","conversion would truncate value");
    puVar11 = debug_assert::detail::regular_void::operator_cast_to_unsigned_char_(&local_99);
    local_5a6 = *puVar11;
  }
  else {
    local_5a6 = (uchar)*local_98;
  }
  local_2f9 = local_5a6;
  local_208 = &local_2e9;
  local_210 = &local_2f9;
  double_val.value_._3_1_ = local_5a6;
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      &stack0xfffffffffffffad8);
  poVar4 = std::operator<<((ostream *)pbVar5,' ');
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                      (integer<unsigned_char,_type_safe::undefined_behavior_arithmetic> *)
                      ((long)&double_val.value_ + 3));
  std::operator<<((ostream *)pbVar5,'\n');
  local_318 = &local_538;
  local_320 = &local_540;
  local_2e0 = &local_538;
  local_2e8 = (undefined1 *)&stack0xfffffffffffffab8;
  local_2c8 = &local_538;
  local_60 = &local_2d8;
  local_538.value_ = 0.5;
  local_4c = 0;
  local_2d8 = 0x3fe0000000000000;
  local_540 = 0x3fb999999999999a;
  uStack_548 = 0x3fe0000000000000;
  local_2cc = 0x3f000000;
  local_2b0 = local_2bc;
  local_2b8 = &local_2cc;
  local_54c.value_ = 0.5;
  local_58 = local_2c8;
  local_48 = local_60;
  pbVar5 = type_safe::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_538);
  poVar4 = std::operator<<((ostream *)pbVar5,' ');
  pbVar5 = type_safe::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,&local_54c);
  std::operator<<((ostream *)pbVar5,'\n');
  return i1.value_;
}

Assistant:

int main()
{
    using namespace ts::literals; // for the literal operators

    //=== type safe boolean ===//
    // ts::bool_t is alias for ts::boolean
    ts::bool_t b1(true);
    //    ts::bool_t b2;    // error: no default constructor
    //    ts::bool_t b3(0); // error: 0 is not a bool
    std::cout << "boolean value: " << b1 << '\n';

    ts::bool_t b4 = !b1;
    if (b4)
        std::cout << "b4 is true\n";
    else
        std::cout << "b4 is false\n";

    //    b4 + 0; // error: arithmetic not possible
    //    ++b4;   // error: arithmetic not possible

    //=== type safe integer ===//
    // ts::int_t is alias for ts::integer<int>
    // ts::unsigned_t is alias for ts::integer<unsigned>
    ts::int_t i1(0);
    //    ts::int_t i2;        // error: no default constructor
    //    ts::int_t i3(100ll); // error: long long -> int would be narrowing

    ts::unsigned_t u1(0u);
    //    ts::unsigned_t u2;    // error: no default constructor
    //    ts::unsigned_t u3(0); // error: 0 is signed

    std::cout << "integer value: " << i1 << ' ' << u1 << '\n';

    i1 += 4;
    ts::integer<long long> i4 = i1 + 100ll; // 100ll is long long, so result is long long
    std::cout << i4 << '\n';

    //    --u1; // runtime error: unsigned underflow
    //    -u1;  // error: no unary minus for unsigned

    ts::uint8_t u4(255_u8); // instead of std::uint8_t(255)
    //    u4 += 2;  // error: 2 is signed
    //    u4 += 2_u8; // runtime error: unsigned overflow

    //    only_unsigned(-4); // error: -4 is not unsigned
    //    only_unsigned(10); // error: 10 is not unsigned
    //    only_unsigned(i1); // error: i1 is not unsigned
    only_unsigned(u4);

    ts::unsigned_t u5 = ts::make_unsigned(i1);
    //    ts::unsigned_t u6 = ts::make_unsigned(-i1); // runtime error: value does not fit
    ts::unsigned_t u7 = ts::abs(-i1); // but this works and returns an the unsigned integer
    std::cout << u5 << ' ' << u7 << '\n';

    //    ts::int8_t i5 = ts::make_signed(u4); // runtime error: value does not fit
    ts::int8_t i6 = ts::make_signed(u4 - 200_u8);
    std::cout << i6 << '\n';

    //=== type safe floating points ===//
    // ts::float_t is alias for ts::floating_point<std::float_t> (std::float_t is float)
    // ts::double_t is alias for ts::floating_point<std::double_t> (std::double_t is double)
    ts::float_t f1(0.f);
    //    ts::float_t f2;     // error: no default constructor
    //    ts::float_t f3(0.); // error: 0. is double literal

    ts::double_t d1(0.);
    //    ts::double_t d2;      // error: no default constructor
    ts::double_t d3(0.f); // okay: float -> double is allowed

    std::cout << "floating point value: " << f1 << ' ' << d1 << ' ' << d3 << '\n';

    //    f1++;      // error: no in/decrement for floats
    //    f1 == 0.f; // error: no equality comparison for floats

    //=== narrow cast ===//
    ts::uint32_t uint32_val(325_u32);
    //    ts::uint8_t  uint8_val1 =
    //        ts::narrow_cast<ts::uint8_t>(uint32_val); // runtime error: value does not fit
    uint32_val             = 100_u32;
    ts::uint8_t uint8_val2 = ts::narrow_cast<ts::uint8_t>(uint32_val); // works
    std::cout << uint32_val << ' ' << uint8_val2 << '\n';

    ts::double_t double_val(0.1);
    //    ts::float_t  float_val1 =
    //        ts::narrow_cast<ts::float_t>(double_val); // runtime error: 0.1 is not exact
    double_val             = 0.5;
    ts::float_t float_val2 = ts::narrow_cast<ts::float_t>(double_val); // works, 0.5 is exact
    std::cout << double_val << ' ' << float_val2 << '\n';
}